

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_writer.cpp
# Opt level: O2

data_ptr_t __thiscall duckdb::MetadataWriter::BasePtr(MetadataWriter *this)

{
  byte bVar1;
  data_ptr_t pdVar2;
  idx_t iVar3;
  
  pdVar2 = BufferHandle::Ptr(&(this->block).handle);
  bVar1 = (this->current_pointer).field_0x7;
  iVar3 = MetadataManager::GetMetadataBlockSize(this->manager);
  return pdVar2 + iVar3 * bVar1;
}

Assistant:

data_ptr_t MetadataWriter::BasePtr() {
	return block.handle.Ptr() + current_pointer.index * GetManager().GetMetadataBlockSize();
}